

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  float fVar2;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"numbers.txt","");
  fVar2 = sum(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Sum of all numbers in \'",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numbers.txt",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' is: ",6);
  poVar1 = std::ostream::_M_insert<double>((double)fVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
	auto file_name = "numbers.txt";
	try
	{
		auto num_sum = sum(file_name);
		std::cout << "Sum of all numbers in '" << file_name << "' is: "
			<< num_sum << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}